

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_torn_write.cpp
# Opt level: O0

void FlipWALByte(FileSystem *fs,string *path,idx_t byte_pos)

{
  ulong uVar1;
  pointer pFVar2;
  pointer puVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this;
  undefined8 in_RSI;
  long *in_RDI;
  FileOpenFlags FVar4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> wal_contents;
  idx_t wal_size;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  uchar *in_stack_ffffffffffffff38;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff40;
  FileOpenFlags *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff58;
  optional_ptr<duckdb::FileOpener,_true> local_60;
  FileOpenFlags local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  idx_t local_30;
  undefined2 local_28;
  undefined6 uStack_26;
  undefined1 local_20 [32];
  
  local_48 = duckdb::FileFlags::FILE_FLAGS_READ;
  uStack_40 = _back;
  FVar4._8_8_ = in_RDI;
  FVar4.flags = in_stack_ffffffffffffff58;
  FVar4 = duckdb::FileOpenFlags::operator|(in_stack_ffffffffffffff50,FVar4);
  local_58._8_2_ = FVar4._8_2_;
  local_28._0_1_ = local_58.lock;
  local_28._1_1_ = local_58.compression;
  local_58.flags = FVar4.flags;
  local_30 = local_58.flags;
  local_58 = FVar4;
  duckdb::optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_60,(FileOpener *)0x0);
  (**(code **)(*in_RDI + 0x10))
            (local_20,in_RDI,in_RSI,local_30,CONCAT62(uStack_26,local_28),local_60.ptr);
  duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
            ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             in_stack_ffffffffffffff40);
  uVar1 = duckdb::FileHandle::GetFileSize();
  operator_new__(uVar1);
  duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>,true>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pFVar2 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)in_stack_ffffffffffffff40);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (in_stack_ffffffffffffff40);
  duckdb::FileHandle::Read(pFVar2,(ulong)puVar3,uVar1);
  this = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
         duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true>::operator[]
                   ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)
                    in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  *(char *)&(((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> *)
             &this->_M_t)->_M_t).
            super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
            super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       *(char *)&(((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> *)
                  &this->_M_t)->_M_t).
                 super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                 .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl + '\x01';
  pFVar2 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)this);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(this);
  duckdb::FileHandle::Write(pFVar2,(ulong)puVar3,uVar1);
  duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)0x7a96f2);
  duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             0x7a96ff);
  return;
}

Assistant:

static void FlipWALByte(FileSystem &fs, const string &path, idx_t byte_pos) {
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_READ);
	idx_t wal_size = handle->GetFileSize();
	auto wal_contents = duckdb::unique_ptr<data_t[]>(new data_t[wal_size]);
	handle->Read(wal_contents.get(), wal_size, 0);
	wal_contents[byte_pos]++;
	handle->Write(wal_contents.get(), wal_size, 0);
}